

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpanContextTest.cpp
# Opt level: O3

void __thiscall
jaegertracing::SpanContext_testBaggage_Test::TestBody(SpanContext_testBaggage_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  int iVar3;
  char *pcVar4;
  long lVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  string valueCopy;
  string keyCopy;
  SpanContext spanContext;
  long *local_200;
  TraceID local_1f8;
  undefined1 local_1e1;
  AssertHelper local_1e0 [8];
  string local_1d8;
  undefined1 local_1b8 [56];
  _Any_data local_180;
  code *local_170;
  code *local_168;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_160;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_120;
  SpanContext local_e0;
  
  local_1f8._high = 0;
  local_1f8._low = 0;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[5],_const_char_(&)[7],_true>
            (&local_160,(char (*) [5])"key1",(char (*) [7])"value1");
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[5],_const_char_(&)[7],_true>
            (&local_120,(char (*) [5])"key2",(char (*) [7])"value2");
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_Hashtable<std::pair<std::__cxx11::string_const,std::__cxx11::string>const*>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)local_1b8,&local_160,&local_e0,0,&local_200,local_1e0,&local_1e1);
  paVar1 = &local_1d8.field_2;
  pcVar4 = "";
  local_1d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"","");
  SpanContext::SpanContext(&local_e0,&local_1f8,0,0,'\0',(StrMap *)local_1b8,&local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_1b8);
  lVar5 = -0x80;
  paVar6 = &local_120.second.field_2;
  do {
    if (paVar6 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*(undefined1 **)(paVar6->_M_local_buf + -0x10)) {
      operator_delete(*(undefined1 **)(paVar6->_M_local_buf + -0x10));
    }
    if (paVar6->_M_local_buf + -0x20 != *(char **)(paVar6->_M_local_buf + -0x30)) {
      operator_delete(*(char **)(paVar6->_M_local_buf + -0x30));
    }
    paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(paVar6->_M_local_buf + -0x40);
    lVar5 = lVar5 + 0x40;
  } while (lVar5 != 0);
  paVar6 = &local_160.first.field_2;
  local_160.first._M_string_length = 0;
  local_160.first.field_2._M_local_buf[0] = '\0';
  local_1b8._8_8_ = 0;
  local_1b8[0x10] = '\0';
  local_168 = std::
              _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/SpanContextTest.cpp:95:9)>
              ::_M_invoke;
  local_170 = std::
              _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/SpanContextTest.cpp:95:9)>
              ::_M_manager;
  local_1b8._0_8_ = local_1b8 + 0x10;
  local_180._M_unused._M_object = &local_160;
  local_180._8_8_ =
       (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        *)local_1b8;
  local_160.first._M_dataplus._M_p = (pointer)paVar6;
  SpanContext::ForeachBaggageItem
            (&local_e0,
             (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&local_180);
  if (local_170 != (code *)0x0) {
    (*local_170)(&local_180,&local_180,__destroy_functor);
  }
  iVar3 = std::__cxx11::string::compare((char *)&local_160);
  if (iVar3 == 0) {
    local_1f8._high = CONCAT71(local_1f8._high._1_7_,1);
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)&local_160);
    local_1f8._high = CONCAT71(local_1f8._high._1_7_,iVar3 == 0);
    local_1f8._low = 0;
    if (iVar3 != 0) {
      testing::Message::Message((Message *)&local_200);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)&local_1d8,(char *)&local_1f8,
                 "keyCopy == \"key1\" || keyCopy == \"key2\"","false");
      testing::internal::AssertHelper::AssertHelper
                (local_1e0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/SpanContextTest.cpp"
                 ,0x65,local_1d8._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(local_1e0,(Message *)&local_200);
      testing::internal::AssertHelper::~AssertHelper(local_1e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != paVar1) {
        operator_delete(local_1d8._M_dataplus._M_p);
      }
      if (local_200 != (long *)0x0) {
        cVar2 = testing::internal::IsTrue(true);
        if ((cVar2 != '\0') && (local_200 != (long *)0x0)) {
          (**(code **)(*local_200 + 8))();
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_1f8._low,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      goto LAB_00186a7c;
    }
  }
  local_1f8._low = 0;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_1f8._low,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  iVar3 = std::__cxx11::string::compare((char *)&local_160);
  if (iVar3 == 0) {
    testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
              ((internal *)&local_1d8,"\"value1\"","valueCopy",(char (*) [7])"value1",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8);
    if ((char)local_1d8._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_1f8);
      if ((undefined8 *)local_1d8._M_string_length == (undefined8 *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = *(char **)local_1d8._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_200,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/SpanContextTest.cpp"
                 ,0x67,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_200,(Message *)&local_1f8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_200);
      if ((long *)local_1f8._high != (long *)0x0) {
        cVar2 = testing::internal::IsTrue(true);
        if ((cVar2 != '\0') && ((long *)local_1f8._high != (long *)0x0)) {
          (**(code **)(*(long *)local_1f8._high + 8))();
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_1d8._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_1d8._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
  }
  else {
    testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
              ((internal *)&local_1d8,"\"value2\"","valueCopy",(char (*) [7])"value2",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8);
    if ((char)local_1d8._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_1f8);
      if ((undefined8 *)local_1d8._M_string_length != (undefined8 *)0x0) {
        pcVar4 = *(char **)local_1d8._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_200,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/SpanContextTest.cpp"
                 ,0x6a,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_200,(Message *)&local_1f8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_200);
      if ((long *)local_1f8._high != (long *)0x0) {
        cVar2 = testing::internal::IsTrue(true);
        if ((cVar2 != '\0') && ((long *)local_1f8._high != (long *)0x0)) {
          (**(code **)(*(long *)local_1f8._high + 8))();
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_1d8._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_1d8._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
  }
LAB_00186a7c:
  if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
    operator_delete((void *)local_1b8._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160.first._M_dataplus._M_p != paVar6) {
    operator_delete(local_160.first._M_dataplus._M_p);
  }
  local_e0.super_SpanContext._vptr_SpanContext = (_func_int **)&PTR__SpanContext_0020a2e8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._debugID._M_dataplus._M_p != &local_e0._debugID.field_2) {
    operator_delete(local_e0._debugID._M_dataplus._M_p);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_e0._baggage._M_h);
  return;
}

Assistant:

TEST(SpanContext, testFromStream)
{
    const FromStreamTestCase testCases[] = {
        { "", false },
        { "abcd", false },
        { "ABCD", false },
        { "x:1:1:1", false },
        { "1:x:1:1", false },
        { "1:1:x:1", false },
        { "1:1:1:x", false },
        { "01234567890123456789012345678901234:1:1:1", false },
        { "01234567890123456789012345678901:1:1:1", true },
        { "01234_67890123456789012345678901:1:1:1", false },
        { "0123456789012345678901_345678901:1:1:1", false },
        { "1:0123456789012345:1:1", true },
        { "1:01234567890123456:1:1", false },
        { "10000000000000001:1:1:1", true },
        { "10000000000000001:1:1", false },
        { "1:1:1:1", true }
    };

    for (auto&& testCase : testCases) {
        SpanContext spanContext;
        {
            std::stringstream ss;
            ss << testCase._input;
            spanContext = SpanContext::fromStream(ss);
            ASSERT_EQ(testCase._success, spanContext.isValid())
                << "input=" << testCase._input;
        }

        SpanContext spanContextFromStreamOp;
        {
            std::stringstream ss;
            ss << testCase._input;
            ss >> spanContextFromStreamOp;
        }

        ASSERT_EQ(spanContext, spanContextFromStreamOp);
    }
}